

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

loc choose_random_entrance
              (chunk_conflict *c,wchar_t ridx,loc *tgt,wchar_t bias,loc *exc,wchar_t nexc)

{
  wchar_t wVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  undefined4 *p;
  loc lVar4;
  int local_88;
  int local_84;
  int local_80;
  wchar_t local_78;
  wchar_t mid;
  wchar_t high;
  wchar_t low;
  wchar_t chosen;
  wchar_t biased;
  wchar_t d;
  int local_5c;
  int iStack_58;
  loc diff;
  wchar_t j;
  _Bool included;
  wchar_t i;
  int *accum;
  wchar_t nchoice;
  wchar_t nexc_local;
  loc *exc_local;
  wchar_t bias_local;
  loc *tgt_local;
  wchar_t ridx_local;
  chunk_conflict *c_local;
  
  if ((ridx < L'\0') || (dun->cent_n <= ridx)) {
    __assert_fail("ridx >= 0 && ridx < dun->cent_n",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                  ,0xcc,
                  "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                 );
  }
  if (0 < dun->ent_n[ridx]) {
    accum._0_4_ = 0;
    p = (undefined4 *)mem_alloc((long)(dun->ent_n[ridx] + 1) << 2);
    *p = 0;
    for (j = L'\0'; j < dun->ent_n[ridx]; j = j + L'\x01') {
      diff.y._3_1_ = square_is_granite_with_flag(c,(loc)dun->ent[ridx][j],L'\f');
      if (diff.y._3_1_) {
        for (diff.x = 0; diff.x < nexc; diff.x = diff.x + 1) {
          lVar4 = loc_diff((loc)dun->ent[ridx][j],exc[diff.x]);
          local_5c = lVar4.x;
          if (local_5c < 0) {
            local_80 = -local_5c;
          }
          else {
            local_80 = local_5c;
          }
          if (local_80 < 2) {
            iStack_58 = lVar4.y;
            if ((long)lVar4 < 0) {
              local_84 = -iStack_58;
            }
            else {
              local_84 = iStack_58;
            }
            if ((local_84 < 2) && ((local_5c != 0 || (iStack_58 != 0)))) {
              diff.y._3_1_ = false;
              break;
            }
          }
        }
      }
      if (diff.y._3_1_ == false) {
        p[j + L'\x01'] = p[j];
      }
      else {
        if (tgt == (loc *)0x0) {
          p[j + L'\x01'] = p[j] + 1;
        }
        else {
          if (bias < L'\0') {
            __assert_fail("bias >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                          ,0xf1,
                          "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                         );
          }
          wVar1 = distance((loc)dun->ent[ridx][j],*tgt);
          if (wVar1 == L'\0') {
            mem_free(p);
            return (loc)dun->ent[ridx][j];
          }
          if (bias - wVar1 < 2) {
            local_88 = 1;
          }
          else {
            local_88 = bias - wVar1;
          }
          p[j + L'\x01'] = p[j] + local_88 * local_88;
        }
        accum._0_4_ = (int)accum + 1;
      }
    }
    if (0 < (int)accum) {
      uVar2 = Rand_div(p[dun->ent_n[ridx]]);
      mid = L'\0';
      wVar1 = dun->ent_n[ridx];
      while (local_78 = wVar1, mid != local_78 + L'\xffffffff') {
        wVar3 = (mid + local_78) / 2;
        wVar1 = wVar3;
        if ((int)p[wVar3] <= (int)uVar2) {
          wVar1 = local_78;
          mid = wVar3;
        }
      }
      if (((int)p[mid] <= (int)uVar2) && ((int)uVar2 < (int)p[local_78])) {
        mem_free(p);
        return (loc)dun->ent[ridx][mid];
      }
      __assert_fail("accum[low] <= chosen && accum[high] > chosen",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                    ,0x115,
                    "struct loc choose_random_entrance(struct chunk *, int, const struct loc *, int, const struct loc *, int)"
                   );
    }
    mem_free(p);
  }
  lVar4 = loc(0,0);
  return lVar4;
}

Assistant:

static struct loc choose_random_entrance(struct chunk *c, int ridx,
	const struct loc *tgt, int bias, const struct loc *exc, int nexc)
{
	assert(ridx >= 0 && ridx < dun->cent_n);
	if (dun->ent_n[ridx] > 0) {
		int nchoice = 0;
		int *accum = mem_alloc((dun->ent_n[ridx] + 1) *
			sizeof(*accum));
		int i;

		accum[0] = 0;
		for (i = 0; i < dun->ent_n[ridx]; ++i) {
			bool included = square_is_granite_with_flag(c,
				dun->ent[ridx][i], SQUARE_WALL_OUTER);

			if (included) {
				int j = 0;

				while (1) {
					struct loc diff;

					if (j >= nexc) {
						break;
					}
					diff = loc_diff(dun->ent[ridx][i],
						exc[j]);
					if (ABS(diff.x) <= 1 &&
							ABS(diff.y) <= 1 &&
							(diff.x != 0 ||
							diff.y != 0)) {
						included = false;
						break;
					}
					++j;
				}
			}
			if (included) {
				if (tgt) {
					int d, biased;

					assert(bias >= 0);
					d = distance(dun->ent[ridx][i], *tgt);
					if (d == 0) {
						/*
						 * There's an exact match.  Use
						 * it.
						 */
						mem_free(accum);
						return dun->ent[ridx][i];
					}

					biased = MAX(1, bias - d);
					/*
					 * Squaring here is just a guess without
					 * any specific reason to back it.
					 */
					accum[i + 1] = accum[i] +
						biased * biased;
				} else {
					accum[i + 1] = accum[i] + 1;
				}
				++nchoice;
			} else {
				accum[i + 1] = accum[i];
			}
		}
		if (nchoice > 0) {
			int chosen = randint0(accum[dun->ent_n[ridx]]);
			int low = 0, high = dun->ent_n[ridx];

			/* Locate the selection by binary search. */
			while (1) {
				int mid;

				if (low == high - 1) {
					assert(accum[low] <= chosen &&
						accum[high] > chosen);
					mem_free(accum);
					return dun->ent[ridx][low];
				}
				mid = (low + high) / 2;
				if (accum[mid] <= chosen) {
					low = mid;
				} else {
					high = mid;
				}
			}
		}
		mem_free(accum);
	}

	/* There's no satisfactory marked entrances. */
	return loc(0, 0);
}